

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

lysc_must ** lysc_node_musts_p(lysc_node *node)

{
  uint16_t uVar1;
  
  if (node == (lysc_node *)0x0) {
    return (lysc_must **)0x0;
  }
  uVar1 = node->nodetype;
  if (uVar1 != 0x2000) {
    if ((uVar1 == 4) || (uVar1 == 8)) {
LAB_0015de5f:
      return (lysc_must **)(node + 1);
    }
    if (uVar1 != 0x10) {
      if ((uVar1 == 0x20) || (uVar1 == 0x60)) goto LAB_0015de5f;
      if (((uVar1 != 0x400) && (uVar1 != 0x1000)) && (uVar1 != 1)) {
        return (lysc_must **)0x0;
      }
    }
  }
  return (lysc_must **)&node[1].module;
}

Assistant:

struct lysc_must **
lysc_node_musts_p(const struct lysc_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysc_node_container *)node)->musts;
    case LYS_LEAF:
        return &((struct lysc_node_leaf *)node)->musts;
    case LYS_LEAFLIST:
        return &((struct lysc_node_leaflist *)node)->musts;
    case LYS_LIST:
        return &((struct lysc_node_list *)node)->musts;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysc_node_anydata *)node)->musts;
    case LYS_NOTIF:
        return &((struct lysc_node_notif *)node)->musts;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysc_node_action_inout *)node)->musts;
    default:
        return NULL;
    }
}